

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eoclient.cpp
# Opt level: O2

bool __thiscall
EOClient::Upload(EOClient *this,FileType type,string *filename,size_t file_start,size_t file_length,
                InitReply init_reply)

{
  pointer pcVar1;
  size_t sVar2;
  size_t sVar3;
  int iVar4;
  FILE *__stream;
  ulong uVar5;
  size_t sVar6;
  runtime_error *this_00;
  size_t sVar7;
  bool bVar8;
  undefined1 auVar9 [16];
  array<char,_10UL> pub_header_bytes;
  string local_80;
  PacketBuilder builder;
  
  if (this->upload_fh != (FILE *)0x0) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Already uploading file");
LAB_0012756d:
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (0xf9f8 < file_length) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"File is too large to send");
    goto LAB_0012756d;
  }
  __stream = fopen((filename->_M_dataplus)._M_p,"rb");
  this->upload_fh = (FILE *)__stream;
  if (__stream == (FILE *)0x0) {
LAB_001274f9:
    bVar8 = false;
  }
  else {
    if (file_length == 0) {
      iVar4 = fseek(__stream,0,2);
      if (iVar4 != 0) {
        fclose((FILE *)this->upload_fh);
        goto LAB_001274f9;
      }
      sVar7 = ftell((FILE *)this->upload_fh);
      fseek((FILE *)this->upload_fh,0,0);
    }
    else {
      sVar7 = file_length + 10;
    }
    this->upload_type = type;
    this->upload_pos = 0;
    this->upload_size = sVar7;
    uVar5 = (this->super_Client).send_buffer._M_string_length;
    do {
      bVar8 = uVar5 < sVar7 + 6;
      uVar5 = uVar5 * 2;
    } while (bVar8);
    std::__cxx11::string::resize((ulong)&this->send_buffer2);
    this->send_buffer2_gpos = 0;
    this->send_buffer2_ppos = 0;
    this->send_buffer2_used = 0;
    std::__cxx11::string::swap((string *)&(this->super_Client).send_buffer);
    sVar7 = this->send_buffer2_ppos;
    sVar2 = (this->super_Client).send_buffer_gpos;
    sVar3 = (this->super_Client).send_buffer_ppos;
    (this->super_Client).send_buffer_gpos = this->send_buffer2_gpos;
    (this->super_Client).send_buffer_ppos = sVar7;
    this->send_buffer2_gpos = sVar2;
    this->send_buffer2_ppos = sVar3;
    sVar7 = (this->super_Client).send_buffer_used;
    (this->super_Client).send_buffer_used = this->send_buffer2_used;
    this->send_buffer2_used = sVar7;
    PacketBuilder::PacketBuilder(&builder,PACKET_F_INIT,PACKET_A_INIT,2);
    PacketBuilder::AddChar(&builder,(uint)init_reply);
    if (type != FILE_MAP) {
      PacketBuilder::AddChar(&builder,this->upload_file_id);
    }
    PacketBuilder::AddSize(&builder,this->upload_size);
    PacketBuilder::operator_cast_to_string(&local_80,&builder);
    Client::Send(&this->super_Client,&local_80);
    std::__cxx11::string::~string((string *)&local_80);
    bVar8 = true;
    if (file_start != 0) {
      sVar6 = fread(&pub_header_bytes,1,10,(FILE *)this->upload_fh);
      iVar4 = (int)sVar6;
      if ((ulong)(long)iVar4 < 10) {
        bVar8 = false;
      }
      else {
        pcVar1 = (this->super_Client).send_buffer._M_dataplus._M_p;
        sVar7 = (this->super_Client).send_buffer_ppos;
        *(undefined2 *)(pcVar1 + sVar7 + 8) = pub_header_bytes._M_elems._8_2_;
        *(undefined8 *)(pcVar1 + sVar7) = pub_header_bytes._M_elems._0_8_;
        this->upload_pos = this->upload_pos + (long)iVar4;
        auVar9._0_8_ = (long)iVar4;
        auVar9._8_4_ = iVar4;
        auVar9._12_4_ = iVar4 >> 0x1f;
        (this->super_Client).send_buffer_ppos = auVar9._0_8_ + (this->super_Client).send_buffer_ppos
        ;
        (this->super_Client).send_buffer_used = auVar9._8_8_ + (this->super_Client).send_buffer_used
        ;
        if (file_start != 10) {
          fseek((FILE *)this->upload_fh,file_start,0);
        }
      }
    }
    PacketBuilder::~PacketBuilder(&builder);
  }
  return bVar8;
}

Assistant:

bool EOClient::Upload(FileType type, const std::string &filename, std::size_t file_start, std::size_t file_length, InitReply init_reply)
{
	using std::swap;

	if (this->upload_fh)
		throw std::runtime_error("Already uploading file");

	if (file_length > 63992)
		throw std::runtime_error("File is too large to send");

	this->upload_fh = std::fopen(filename.c_str(), "rb");

	if (!this->upload_fh)
		return false;

	// The size of all pub file headers is 10 bytes
	std::array<char, 10> pub_header_bytes;

	if (file_length == 0)
	{
		if (std::fseek(this->upload_fh, 0, SEEK_END) != 0)
		{
			std::fclose(this->upload_fh);
			return false;
		}

		file_length = std::ftell(this->upload_fh);
		std::fseek(this->upload_fh, 0, SEEK_SET);
	}
	else
	{
		file_length += pub_header_bytes.size();
	}

	this->upload_type = type;
	this->upload_pos = 0;
	this->upload_size = file_length;

	std::size_t temp_buffer_size = this->send_buffer.size();

	// Allocate a power-of-two buffer size large enough to hold the file
	while (temp_buffer_size < this->upload_size + 6)
		temp_buffer_size *= 2;

	this->send_buffer2.resize(temp_buffer_size);
	this->send_buffer2_gpos = 0;
	this->send_buffer2_ppos = 0;
	this->send_buffer2_used = 0;

	swap(this->send_buffer, this->send_buffer2);
	swap(this->send_buffer_gpos, this->send_buffer2_gpos);
	swap(this->send_buffer_ppos, this->send_buffer2_ppos);
	swap(this->send_buffer_used, this->send_buffer2_used);

	// Build the file upload header packet
	PacketBuilder builder(PACKET_F_INIT, PACKET_A_INIT, 2);
	builder.AddChar(init_reply);

	if (type != FILE_MAP)
		builder.AddChar(this->upload_file_id);

	builder.AddSize(this->upload_size);

	Client::Send(builder);

	// Copy the header from dat001 in to higher numbered files
	if (file_start != 0)
	{
		int bytes_read = std::fread(&pub_header_bytes[0], 1, pub_header_bytes.size(), this->upload_fh);

		if (bytes_read < sizeof pub_header_bytes)
			return false;

		std::copy(pub_header_bytes.begin(), pub_header_bytes.end(), this->send_buffer.begin() + this->send_buffer_ppos);

		this->upload_pos += bytes_read;
		this->send_buffer_ppos += bytes_read;
		this->send_buffer_used += bytes_read;

		if (file_start != pub_header_bytes.size())
			std::fseek(this->upload_fh, file_start, SEEK_SET);
	}

	return true;
}